

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_flattener.h
# Opt level: O0

EExpr * __thiscall
mp::
ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::VisitPLTerm(ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
              *this,PLTerm e)

{
  Reference other;
  Expr e_00;
  reference pvVar1;
  ExprBase fc;
  EExpr *in_RDI;
  double dVar2;
  ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *this_00;
  int i;
  vector<double,_std::allocator<double>_> breakpoints;
  vector<double,_std::allocator<double>_> slopes;
  int num_breakpoints;
  undefined4 in_stack_fffffffffffffda8;
  int in_stack_fffffffffffffdac;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffdb0;
  CustomFunctionalConstraint<std::array<int,_1UL>,_mp::PLConParams,_mp::NumericFunctionalConstraintTraits,_mp::PLId>
  *this_01;
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> *in_stack_fffffffffffffdb8;
  PLSlopes *pls;
  undefined4 in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffdc4;
  size_type in_stack_fffffffffffffdc8;
  vector<double,_std::allocator<double>_> *bp;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffdd0;
  Parameters *in_stack_fffffffffffffe30;
  CustomFunctionalConstraint<std::array<int,_1UL>,_mp::PLConParams,_mp::NumericFunctionalConstraintTraits,_mp::PLId>
  *in_stack_fffffffffffffe38;
  Arguments in_stack_fffffffffffffe44;
  vector<double,_std::allocator<double>_> local_114 [6];
  ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *in_stack_ffffffffffffff88;
  int iVar3;
  undefined4 in_stack_ffffffffffffff94;
  vector<double,_std::allocator<double>_> local_68 [2];
  vector<double,_std::allocator<double>_> local_38;
  int local_1c;
  
  local_1c = PLTerm::num_breakpoints((PLTerm *)0x3db1d6);
  std::allocator<double>::allocator((allocator<double> *)0x3db1ff);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
             (allocator_type *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0));
  std::allocator<double>::~allocator((allocator<double> *)0x3db225);
  std::allocator<double>::allocator((allocator<double> *)0x3db244);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
             (allocator_type *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0));
  std::allocator<double>::~allocator((allocator<double> *)0x3db26a);
  for (iVar3 = 0; iVar3 < local_1c; iVar3 = iVar3 + 1) {
    dVar2 = PLTerm::slope((PLTerm *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffdac);
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](&local_38,(long)iVar3);
    *pvVar1 = dVar2;
    dVar2 = PLTerm::breakpoint((PLTerm *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffdac);
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](local_68,(long)iVar3);
    *pvVar1 = dVar2;
  }
  this_00 = (ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
             *)PLTerm::slope((PLTerm *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffdac);
  pvVar1 = std::vector<double,_std::allocator<double>_>::back(in_stack_fffffffffffffdb0);
  *pvVar1 = (value_type)this_00;
  bp = local_114;
  fc.impl_ = (Impl *)PLTerm::arg((PLTerm *)
                                 CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
  other.super_BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3>.super_ExprBase.impl_._4_4_ =
       in_stack_fffffffffffffdc4;
  other.super_BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3>.super_ExprBase.impl_._0_4_ =
       in_stack_fffffffffffffdc0;
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>::BasicExpr<mp::Reference>
            (in_stack_fffffffffffffdb8,other,(type)((ulong)in_stack_fffffffffffffdb0 >> 0x20));
  e_00.super_ExprBase.impl_._4_4_ = in_stack_ffffffffffffff94;
  e_00.super_ExprBase.impl_._0_4_ = iVar3;
  iVar3 = Convert2Var(in_stack_ffffffffffffff88,e_00);
  *(int *)&(bp->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
           ._M_start = iVar3;
  pls = (PLSlopes *)&stack0xfffffffffffffe28;
  PLSlopes::PLSlopes<std::vector<double,std::allocator<double>>&>
            ((PLSlopes *)fc.impl_,bp,
             (vector<double,_std::allocator<double>_> *)CONCAT44(iVar3,in_stack_fffffffffffffdc0),
             (double)pls,(double)in_stack_fffffffffffffdb0);
  PLConParams::PLConParams((PLConParams *)CONCAT44(iVar3,in_stack_fffffffffffffdc0),pls);
  this_01 = (CustomFunctionalConstraint<std::array<int,_1UL>,_mp::PLConParams,_mp::NumericFunctionalConstraintTraits,_mp::PLId>
             *)((long)&local_114[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start + 4);
  CustomFunctionalConstraint<std::array<int,_1UL>,_mp::PLConParams,_mp::NumericFunctionalConstraintTraits,_mp::PLId>
  ::CustomFunctionalConstraint
            (in_stack_fffffffffffffe38,in_stack_fffffffffffffe44,in_stack_fffffffffffffe30);
  ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>>,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>>
  ::
  AssignResult2Args<mp::CustomFunctionalConstraint<std::array<int,1ul>,mp::PLConParams,mp::NumericFunctionalConstraintTraits,mp::PLId>>
            (this_00,(CustomFunctionalConstraint<std::array<int,_1UL>,_mp::PLConParams,_mp::NumericFunctionalConstraintTraits,_mp::PLId>
                      *)fc.impl_);
  CustomFunctionalConstraint<std::array<int,_1UL>,_mp::PLConParams,_mp::NumericFunctionalConstraintTraits,_mp::PLId>
  ::~CustomFunctionalConstraint(this_01);
  PLConParams::~PLConParams((PLConParams *)this_01);
  PLSlopes::~PLSlopes((PLSlopes *)this_01);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)CONCAT44(iVar3,in_stack_fffffffffffffdc0));
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)CONCAT44(iVar3,in_stack_fffffffffffffdc0));
  return in_RDI;
}

Assistant:

EExpr VisitPLTerm(PLTerm e) {
    int num_breakpoints = e.num_breakpoints();
    std::vector<double> slopes(num_breakpoints+1), breakpoints(num_breakpoints);
    for (int i = 0; i < num_breakpoints; ++i) {
      slopes[i] = e.slope(i);
      breakpoints[i] = e.breakpoint(i);
    }
    slopes.back() = e.slope(num_breakpoints);
    return AssignResult2Args( PLConstraint(
          PLConstraint::Arguments{ Convert2Var(e.arg()) },
          PLConstraint::Parameters{
                                  PLSlopes{
                                    breakpoints, slopes, 0.0, 0.0 } } ) );
  }